

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void mwFree(void *p,char *file,int line)

{
  mwData *mw;
  char *file_00;
  int iVar1;
  mwStat *pmVar2;
  mwData *pmVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  undefined4 *puVar7;
  
  if (file == (char *)0x0) {
    mwFree_(p);
    return;
  }
  mwAutoInit();
  if (mwTestAlways != 0) {
    mwTestNow(file,line,1);
  }
  mwCounter = mwCounter + 1;
  if (p == (void *)0x0) {
    mwWrite("NULL free: <%ld> %s(%d), NULL pointer free\'d\n",mwCounter,file,(ulong)(uint)line);
  }
  else {
    pvVar6 = (void *)((long)p + -0x38);
    if (mwDataSize == '\0') {
      pvVar6 = p;
    }
    mw = (mwData *)((long)pvVar6 + -8);
    iVar1 = mwIsOwned(mw,file,line);
    if (iVar1 != 0) {
      mwTestBuf(mw,file,line);
      if ((*(byte *)((long)pvVar6 + 0x2c) & 1) == 0) {
        mwNumCurAlloc = mwNumCurAlloc + -1;
        lVar4 = *(long *)((long)pvVar6 + 0x20);
        mwStatCurAlloc = mwStatCurAlloc - lVar4;
        if (mwStatLevel != 0) {
          file_00 = *(char **)((long)pvVar6 + 8);
          iVar1 = *(int *)((long)pvVar6 + 0x28);
          pmVar2 = mwStatGet(file_00,-1,1);
          if (pmVar2 != (mwStat *)0x0) {
            pmVar2->curr = pmVar2->curr - lVar4;
          }
          if (((file_00 != (char *)0x0) && (iVar1 != -1)) && (1 < mwStatLevel)) {
            pmVar2 = mwStatGet(file_00,iVar1,1);
            if (pmVar2 != (mwStat *)0x0) {
              pmVar2->curr = pmVar2->curr - lVar4;
            }
          }
        }
        if (mwNML == 0) {
          mwUnlink(mw,file,line);
          lVar4 = 0x38;
          if (mwDataSize == '\0') {
            lVar4 = 0;
          }
          memset(mw,0xfd,lVar4 + *(long *)((long)pvVar6 + 0x20) + 0x10);
          free(mw);
        }
        else {
          *(byte *)((long)pvVar6 + 0x2c) = *(byte *)((long)pvVar6 + 0x2c) | 1;
          mwNmlNumAlloc = mwNmlNumAlloc + 1;
          mwNmlCurAlloc = mwNmlCurAlloc + *(size_t *)((long)pvVar6 + 0x20);
          pmVar3 = (mwData *)((long)pvVar6 + 0x30);
          if (mwDataSize == '\0') {
            pmVar3 = mw;
          }
          memset(&pmVar3->next,0xfc,*(size_t *)((long)pvVar6 + 0x20));
        }
        lVar4 = (long)mwLFcur;
        mwLFfile[lVar4] = file;
        mwLFline[lVar4] = line;
        iVar1 = mwLFcur + 1;
        mwLFcur = iVar1;
        mwLastFree[lVar4] = p;
        if (iVar1 == 0x40) {
          mwLFcur = 0;
        }
        return;
      }
      pmVar3 = (mwData *)((long)pvVar6 + 0x30);
      if (mwDataSize == '\0') {
        pmVar3 = mw;
      }
      if (*(char *)&pmVar3->next != -4) {
        mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",mwCounter,file,
                (ulong)(uint)line,mw);
      }
    }
    puVar7 = (undefined4 *)((long)mwLFfile + 0x1fc);
    lVar4 = 0;
    do {
      lVar5 = lVar4;
      if (lVar5 == 0x200) {
        mwIncErr();
        mwWrite("WILD free: <%ld> %s(%d), unknown pointer %p\n",mwCounter,file,(ulong)(uint)line,p);
        goto LAB_00107847;
      }
      puVar7 = puVar7 + 1;
      lVar4 = lVar5 + 8;
    } while (*(void **)((long)mwLastFree + lVar5) != p);
    mwIncErr();
    mwWrite("double-free: <%ld> %s(%d), %p was freed from %s(%d)\n",mwCounter,file,(ulong)(uint)line
            ,p,*(undefined8 *)((long)mwLFfile + lVar5),*puVar7);
  }
LAB_00107847:
  mwFlush();
  return;
}

Assistant:

void mwFree(void *p, const char *file, int line)
{
	int i;
	mwData *mw;
	char buffer[ sizeof(mwData) + (mwROUNDALLOC * 3) + 64 ];

	/* this code is in support of C++ delete */
	if (file == NULL) {
		mwFree_(p);
		MW_MUTEX_UNLOCK();
		return;
	}

	mwAutoInit();

	MW_MUTEX_LOCK();
	TESTS(file, line);
	mwCounter ++;

	/* on NULL free, write a warning and return */
	if (p == NULL) {
		mwWrite("NULL free: <%ld> %s(%d), NULL pointer free'd\n",
				mwCounter, file, line);
		FLUSH();
		MW_MUTEX_UNLOCK();
		return;
	}

	/* do the quick ownership test */
	mw = (mwData *) mwBUFFER_TO_MW(p);

	if (mwIsOwned(mw, file, line)) {
		(void) mwTestBuf(mw, file, line);

		/* if the buffer is an NML, treat this as a double-free */
		if (mw->flag & MW_NML) {
			if (*(((unsigned char *)mw) + mwDataSize + mwOverflowZoneSize) != MW_VAL_NML) {
				mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",
						mwCounter, file, line, mw);
			}
			goto check_dbl_free;
		}

		/* update the statistics */
		mwNumCurAlloc --;
		mwStatCurAlloc -= (long) mw->size;
		if (mwStatLevel) {
			mwStatFree(mw->size, mw->file, mw->line);
		}

		/* we should either free the allocation or keep it as NML */
		if (mwNML) {
			mw->flag |= MW_NML;
			mwNmlNumAlloc ++;
			mwNmlCurAlloc += (long) mw->size;
			memset(((char *)mw) + mwDataSize + mwOverflowZoneSize, MW_VAL_NML, mw->size);
		} else {
			/* unlink the allocation, and enter the post-free data */
			mwUnlink(mw, file, line);
			memset(mw, MW_VAL_DEL,
				   mw->size + mwDataSize + mwOverflowZoneSize + mwOverflowZoneSize);
			if (mwFBI) {
				memset(mw, '.', mwDataSize + mwOverflowZoneSize);
				sprintf(buffer, "FBI<%ld>%s(%d)", mwCounter, file, line);
				strncpy((char *)(void *)mw, buffer, mwDataSize + mwOverflowZoneSize);
			}
			free(mw);
		}

		/* add the pointer to the last-free track */
		mwLFfile[ mwLFcur ] = file;
		mwLFline[ mwLFcur ] = line;
		mwLastFree[ mwLFcur++ ] = p;
		if (mwLFcur == MW_FREE_LIST) {
			mwLFcur = 0;
		}

		MW_MUTEX_UNLOCK();
		return;
	}

	/* check for double-freeing */
check_dbl_free:
	for (i = 0; i < MW_FREE_LIST; i++) {
		if (mwLastFree[i] == p) {
			mwIncErr();
			mwWrite("double-free: <%ld> %s(%d), %p was"
					" freed from %s(%d)\n",
					mwCounter, file, line, p,
					mwLFfile[i], mwLFline[i]);
			FLUSH();
			MW_MUTEX_UNLOCK();
			return;
		}
	}

	/* some weird pointer... block the free */
	mwIncErr();
	mwWrite("WILD free: <%ld> %s(%d), unknown pointer %p\n",
			mwCounter, file, line, p);
	FLUSH();
	MW_MUTEX_UNLOCK();
	return;
}